

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void KeyCallback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if (-1 < key) {
    if ((uint)action < 3) {
      *(char *)(*(long *)(&DAT_00233be8 + (ulong)(uint)action * 8) + (ulong)(uint)key) =
           (char)(0x10100 >> ((char)action * '\b' & 0x1fU));
    }
    if (((key == 0x118 & (byte)((mods & 0x10U) >> 4)) != 0) || ((mods & 0x20U) != 0 && key == 0x11a)
       ) {
      CORE.Input.Keyboard.currentKeyState[(uint)key] = '\x01';
    }
    if (action == 1 && (long)CORE.Input.Keyboard.keyPressedQueueCount < 0x10) {
      CORE.Input.Keyboard.keyPressedQueue[CORE.Input.Keyboard.keyPressedQueueCount] = key;
      CORE.Input.Keyboard.keyPressedQueueCount = CORE.Input.Keyboard.keyPressedQueueCount + 1;
    }
    if ((action == 1) && (CORE.Input.Keyboard.exitKey == key)) {
      glfwSetWindowShouldClose(platform.handle,1);
      return;
    }
  }
  return;
}

Assistant:

static void KeyCallback(GLFWwindow *window, int key, int scancode, int action, int mods)
{
    if (key < 0) return;    // Security check, macOS fn key generates -1

    // WARNING: GLFW could return GLFW_REPEAT, we need to consider it as 1
    // to work properly with our implementation (IsKeyDown/IsKeyUp checks)
    if (action == GLFW_RELEASE) CORE.Input.Keyboard.currentKeyState[key] = 0;
    else if(action == GLFW_PRESS) CORE.Input.Keyboard.currentKeyState[key] = 1;
    else if(action == GLFW_REPEAT) CORE.Input.Keyboard.keyRepeatInFrame[key] = 1;

    // WARNING: Check if CAPS/NUM key modifiers are enabled and force down state for those keys
    if (((key == KEY_CAPS_LOCK) && ((mods & GLFW_MOD_CAPS_LOCK) > 0)) ||
        ((key == KEY_NUM_LOCK) && ((mods & GLFW_MOD_NUM_LOCK) > 0))) CORE.Input.Keyboard.currentKeyState[key] = 1;

    // Check if there is space available in the key queue
    if ((CORE.Input.Keyboard.keyPressedQueueCount < MAX_KEY_PRESSED_QUEUE) && (action == GLFW_PRESS))
    {
        // Add character to the queue
        CORE.Input.Keyboard.keyPressedQueue[CORE.Input.Keyboard.keyPressedQueueCount] = key;
        CORE.Input.Keyboard.keyPressedQueueCount++;
    }

    // Check the exit key to set close window
    if ((key == CORE.Input.Keyboard.exitKey) && (action == GLFW_PRESS)) glfwSetWindowShouldClose(platform.handle, GLFW_TRUE);
}